

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_PrioritySelect(DdManager *dd,DdNode *R,DdNode **x,DdNode **y,DdNode **z,DdNode *Pi,
                            int n,DD_PRFP Pifunc)

{
  int *piVar1;
  bool bVar2;
  DdNode *pDVar3;
  DdNode **y_00;
  DdNode *n_00;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *g;
  DdNode *local_58;
  
  y_00 = z;
  if (z == (DdNode **)0x0) {
    if (Pi != (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    y_00 = (DdNode **)malloc((long)n << 3);
    if (y_00 == (DdNode **)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    if (0 < n) {
      uVar5 = 0;
      do {
        if (0x7ffffffd < dd->size) {
LAB_0078efde:
          pDVar4 = (DdNode *)0x0;
          local_58 = (DdNode *)0x0;
          bVar2 = false;
          goto LAB_0078ef96;
        }
        pDVar4 = cuddUniqueInter(dd,dd->size,dd->one,(DdNode *)((ulong)dd->one ^ 1));
        y_00[uVar5] = pDVar4;
        if (pDVar4 == (DdNode *)0x0) goto LAB_0078efde;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
      goto LAB_0078ed9e;
    }
LAB_0078eda5:
    Pi = (*Pifunc)(dd,n,x,y,y_00);
    if (Pi == (DdNode *)0x0) {
      bVar2 = false;
      local_58 = (DdNode *)0x0;
      pDVar4 = (DdNode *)0x0;
      goto LAB_0078ef91;
    }
    piVar1 = (int *)(((ulong)Pi & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    bVar2 = true;
  }
  else {
LAB_0078ed9e:
    bVar2 = false;
    if (Pi == (DdNode *)0x0) goto LAB_0078eda5;
  }
  g = dd->one;
  piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (0 < n) {
    uVar5 = (ulong)(uint)n + 1;
    pDVar4 = (DdNode *)0x0;
    do {
      pDVar3 = Cudd_bddAnd(dd,y_00[uVar5 - 2],g);
      if (pDVar3 == (DdNode *)0x0) goto LAB_0078ef77;
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,g);
      uVar5 = uVar5 - 1;
      g = pDVar3;
    } while (1 < uVar5);
  }
  pDVar3 = Cudd_bddSwapVariables(dd,R,y,y_00,n);
  if (pDVar3 == (DdNode *)0x0) {
    pDVar4 = (DdNode *)0x0;
  }
  else {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    n_00 = Cudd_bddAndAbstract(dd,pDVar3,Pi,g);
    if (n_00 == (DdNode *)0x0) {
      pDVar4 = (DdNode *)0x0;
      n_00 = pDVar3;
    }
    else {
      piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar3);
      pDVar4 = Cudd_bddAnd(dd,R,(DdNode *)((ulong)n_00 ^ 1));
      if (pDVar4 == (DdNode *)0x0) {
        pDVar4 = (DdNode *)0x0;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    Cudd_RecursiveDeref(dd,n_00);
  }
LAB_0078ef77:
  local_58 = Pi;
  if (g != (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,g);
  }
LAB_0078ef91:
  if (z == (DdNode **)0x0) {
LAB_0078ef96:
    free(y_00);
  }
  if (bVar2) {
    Cudd_RecursiveDeref(dd,local_58);
  }
  if (pDVar4 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return pDVar4;
}

Assistant:

DdNode *
Cudd_PrioritySelect(
  DdManager * dd /* manager */,
  DdNode * R /* BDD of the relation */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables (optional: may be NULL) */,
  DdNode * Pi /* BDD of the priority function (optional: may be NULL) */,
  int  n /* size of x, y, and z */,
  DD_PRFP Pifunc /* function used to build Pi if it is NULL */)
{
    DdNode *res = NULL;
    DdNode *zcube = NULL;
    DdNode *Rxz, *Q;
    int createdZ = 0;
    int createdPi = 0;
    int i;

    /* Create z variables if needed. */
    if (z == NULL) {
        if (Pi != NULL) return(NULL);
        z = ABC_ALLOC(DdNode *,n);
        if (z == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        createdZ = 1;
        for (i = 0; i < n; i++) {
            if (dd->size >= (int) CUDD_MAXINDEX - 1) goto endgame;
            z[i] = cuddUniqueInter(dd,dd->size,dd->one,Cudd_Not(dd->one));
            if (z[i] == NULL) goto endgame;
        }
    }

    /* Create priority function BDD if needed. */
    if (Pi == NULL) {
        Pi = Pifunc(dd,n,x,y,z);
        if (Pi == NULL) goto endgame;
        createdPi = 1;
        cuddRef(Pi);
    }

    /* Initialize abstraction cube. */
    zcube = DD_ONE(dd);
    cuddRef(zcube);
    for (i = n - 1; i >= 0; i--) {
        DdNode *tmpp;
        tmpp = Cudd_bddAnd(dd,z[i],zcube);
        if (tmpp == NULL) goto endgame;
        cuddRef(tmpp);
        Cudd_RecursiveDeref(dd,zcube);
        zcube = tmpp;
    }

    /* Compute subset of (x,y) pairs. */
    Rxz = Cudd_bddSwapVariables(dd,R,y,z,n);
    if (Rxz == NULL) goto endgame;
    cuddRef(Rxz);
    Q = Cudd_bddAndAbstract(dd,Rxz,Pi,zcube);
    if (Q == NULL) {
        Cudd_RecursiveDeref(dd,Rxz);
        goto endgame;
    }
    cuddRef(Q);
    Cudd_RecursiveDeref(dd,Rxz);
    res = Cudd_bddAnd(dd,R,Cudd_Not(Q));
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,Q);
        goto endgame;
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,Q);

endgame:
    if (zcube != NULL) Cudd_RecursiveDeref(dd,zcube);
    if (createdZ) {
        ABC_FREE(z);
    }
    if (createdPi) {
        Cudd_RecursiveDeref(dd,Pi);
    }
    if (res != NULL) cuddDeref(res);
    return(res);

}